

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O2

void LoadBytes(AES_state *s,uchar *data16)

{
  long lVar1;
  int c;
  int c_00;
  
  for (c_00 = 0; c_00 != 4; c_00 = c_00 + 1) {
    for (lVar1 = 0; (int)lVar1 != 4; lVar1 = lVar1 + 1) {
      LoadByte(s,data16[lVar1],(int)lVar1,c_00);
    }
    data16 = data16 + lVar1;
  }
  return;
}

Assistant:

static void LoadBytes(AES_state *s, const unsigned char* data16) {
    int c;
    for (c = 0; c < 4; c++) {
        int r;
        for (r = 0; r < 4; r++) {
            LoadByte(s, *(data16++), r, c);
        }
    }
}